

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  FSE_CTable FVar8;
  FSE_CTable FVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ushort uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint local_438 [258];
  
  uVar12 = 1 << ((byte)tableLog & 0x1f);
  uVar3 = 1;
  if (tableLog != 0) {
    uVar3 = uVar12 >> 1;
  }
  if (wkspSize >> ((byte)tableLog & 0x3f) == 0) {
    sVar4 = 0xffffffffffffffd4;
  }
  else {
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    local_438[0] = 0;
    uVar5 = (ulong)(maxSymbolValue + 1);
    uVar7 = 0;
    uVar11 = (ulong)(uVar12 - 1);
    uVar15 = 0;
    while( true ) {
      if (uVar5 < uVar15 + 1) break;
      if (normalizedCounter[uVar15] == -1) {
        uVar7 = uVar7 + 1;
        uVar10 = (ulong)((uint)uVar11 - 1);
        *(char *)((long)workSpace + uVar11) = (char)uVar15;
      }
      else {
        uVar7 = uVar7 + (int)normalizedCounter[uVar15];
        uVar10 = uVar11;
      }
      local_438[uVar15 + 1] = uVar7;
      uVar11 = uVar10;
      uVar15 = uVar15 + 1;
    }
    local_438[uVar5] = uVar12 + 1;
    uVar7 = 0;
    for (uVar15 = 0; uVar15 != uVar5; uVar15 = uVar15 + 1) {
      uVar13 = normalizedCounter[uVar15];
      uVar16 = 0;
      if ((short)uVar13 < 1) {
        uVar13 = 0;
      }
      for (; uVar16 != uVar13; uVar16 = uVar16 + 1) {
        *(char *)((long)workSpace + (ulong)uVar7) = (char)uVar15;
        do {
          uVar7 = uVar7 + (uVar12 >> 1) + (uVar12 >> 3) + 3 & uVar12 - 1;
        } while ((uint)uVar11 < uVar7);
      }
    }
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      uVar7 = local_438[*(byte *)((long)workSpace + uVar11)];
      local_438[*(byte *)((long)workSpace + uVar11)] = uVar7 + 1;
      *(short *)((long)ct + (ulong)uVar7 * 2 + 4) = (short)uVar12 + (short)uVar11;
    }
    FVar9 = tableLog * 0x10000 - uVar12;
    sVar4 = 0;
    iVar6 = 0;
    for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
      sVar1 = normalizedCounter[uVar11];
      if ((sVar1 == -1) || (sVar1 == 1)) {
        ct[(ulong)uVar3 + uVar11 * 2 + 2] = FVar9;
        ct[(ulong)uVar3 + uVar11 * 2 + 1] = iVar6 - 1;
        iVar6 = iVar6 + 1;
      }
      else if (sVar1 == 0) {
        ct[(ulong)uVar3 + uVar11 * 2 + 2] = FVar9 + 0x10000;
      }
      else {
        iVar14 = (int)sVar1;
        iVar2 = 0x1f;
        if (iVar14 - 1U != 0) {
          for (; iVar14 - 1U >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        FVar8 = iVar6 - iVar14;
        iVar6 = iVar6 + iVar14;
        ct[(ulong)uVar3 + uVar11 * 2 + 2] =
             (tableLog - iVar2) * 0x10000 - (iVar14 << ((byte)(tableLog - iVar2) & 0x1f));
        ct[(ulong)uVar3 + uVar11 * 2 + 1] = FVar8;
      }
    }
  }
  return sVar4;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 cumul[FSE_MAX_SYMBOL_VALUE+2];

    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)workSpace;
    U32 highThreshold = tableSize-1;

    /* CTable header */
    if (((size_t)1 << tableLog) * sizeof(FSE_FUNCTION_TYPE) > wkspSize) return ERROR(tableLog_tooLarge);
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * http://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSymbolValue+1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                cumul[u] = cumul[u-1] + normalizedCounter[u-1];
        }   }
        cumul[maxSymbolValue+1] = tableSize+1;
    }

    /* Spread symbols */
    {   U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }

        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                symbolTT[s].deltaFindState = total - 1;
                total ++;
                break;
            default :
                {
                    U32 const maxBitsOut = tableLog - BIT_highbit32 (normalizedCounter[s]-1);
                    U32 const minStatePlus = normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = total - normalizedCounter[s];
                    total +=  normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
        }
    }
#endif

    return 0;
}